

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

bool __thiscall Render::loadResources(Render *this)

{
  Map *this_00;
  bool bVar1;
  undefined8 uVar2;
  SDL_Surface *pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  SDL_Rect r;
  
  uVar2 = SDL_RWFromFile("res/cs8x8.bmp","rb");
  pSVar3 = (SDL_Surface *)SDL_LoadBMP_RW(uVar2,1);
  this->charset = pSVar3;
  if (pSVar3 == (SDL_Surface *)0x0) {
    pcVar7 = "res/cs8x8.bmp";
  }
  else {
    SDL_SetColorKey(pSVar3,1,0);
    uVar2 = SDL_RWFromFile("res/tileset.bmp","rb");
    pSVar3 = (SDL_Surface *)SDL_LoadBMP_RW(uVar2,1);
    this->tileset = pSVar3;
    if (pSVar3 == (SDL_Surface *)0x0) {
      pcVar7 = "res/tileset.bmp";
    }
    else {
      SDL_SetColorKey(pSVar3,1,0);
      uVar2 = SDL_RWFromFile("res/drums.bmp","rb");
      pSVar3 = (SDL_Surface *)SDL_LoadBMP_RW(uVar2,1);
      this->backgroundTile = pSVar3;
      if (pSVar3 != (SDL_Surface *)0x0) {
        this_00 = this->map;
        iVar6 = this->screen->w / 2 + -0x138;
        this->startX = iVar6;
        this->startY = 0x28;
        iVar4 = this->screen->h;
        iVar5 = iVar4 + -0x28;
        iVar4 = iVar4 + -0x19;
        if (-1 < iVar5) {
          iVar4 = iVar5;
        }
        iVar5 = (iVar4 >> 4) + 1;
        this->rows = iVar5;
        (this->fieldBG).x = iVar6;
        (this->fieldBG).y = 0x28;
        (this->fieldBG).w = 0x270;
        iVar5 = iVar5 * 0x10;
        (this->fieldBG).h = iVar5;
        Map::setField(this_00,0x238,iVar5 + -0x10);
        pSVar3 = (SDL_Surface *)
                 SDL_CreateRGBSurface
                           (0,(this->fieldBG).w,(this->fieldBG).h,0x20,0xff0000,0xff00,0xff,
                            0xffffffffff000000);
        this->background = pSVar3;
        if (-1 < (this->fieldBG).w / this->backgroundTile->w) {
          iVar5 = 0;
          do {
            pSVar3 = this->backgroundTile;
            iVar4 = pSVar3->h;
            if (-1 < (this->fieldBG).h / iVar4) {
              iVar6 = -1;
              do {
                iVar6 = iVar6 + 1;
                r.w = pSVar3->w;
                r.x = r.w * iVar5;
                r.y = iVar4 * iVar6;
                r.h = iVar4;
                SDL_UpperBlit(pSVar3,0,this->background,&r);
                pSVar3 = this->backgroundTile;
                iVar4 = pSVar3->h;
              } while (iVar6 < (this->fieldBG).h / iVar4);
            }
            bVar1 = iVar5 < (this->fieldBG).w / this->backgroundTile->w;
            iVar5 = iVar5 + 1;
          } while (bVar1);
        }
        parseTileset(this,this->tileset);
        return true;
      }
      pcVar7 = "res/drums.bmp";
    }
  }
  printf("Cannot load: %s\n",pcVar7);
  return false;
}

Assistant:

bool Render::loadResources(){
    // ASCII Charset
    charset = SDL_LoadBMP(RESOURCE_CHARSET);
    if(!charset){
        printf("Cannot load: %s\n", RESOURCE_CHARSET);
        return false;
    }
    SDL_SetColorKey(charset, true, 0x000000);

    // Tileset
    tileset = SDL_LoadBMP(RESOURCE_TILESET);
    if(!tileset){
        printf("Cannot load: %s\n", RESOURCE_TILESET);
        return false;
    }
    SDL_SetColorKey(tileset, true, 0x000000);

    // Background Tile
    backgroundTile = SDL_LoadBMP(RESOURCE_BACKGROUND);
    if(!backgroundTile){
        printf("Cannot load: %s\n", RESOURCE_BACKGROUND);
        return false;
    }

    // Calculate variables
    startX = screen->w/2 - ((BLOCKS_W+2)*BLOCK_W)/2;
    startY = 40;
    rows = (screen->h - startY)/BLOCK_H + 1;
    fieldBG.x = startX;
    fieldBG.y = startY;
    fieldBG.w = (BLOCKS_W+2)*BLOCK_W;
    fieldBG.h = (rows)*BLOCK_H;
    map->setField(fieldBG.w - 2*BLOCK_W - BALL_W, fieldBG.h - BLOCK_H);

    // Pre-render background
    SDL_Rect r;
    background = SDL_CreateRGBSurface(0, fieldBG.w, fieldBG.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
    for(int i=0; i<(fieldBG.w/backgroundTile->w + 1); i++)
        for(int j=0; j<(fieldBG.h/backgroundTile->h +1); j++){
            r.x = i*backgroundTile->w;
            r.y = j*backgroundTile->h;
            r.w = backgroundTile->w;
            r.h = backgroundTile->h;
            SDL_BlitSurface(backgroundTile, nullptr, background, &r);
        }

    parseTileset(tileset);

    return true;
}